

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O1

void __thiscall crnlib::dxt_hc::create_alpha_selector_codebook(dxt_hc *this)

{
  vector<unsigned_long_long> *this_00;
  elemental_vector *this_01;
  task_pool *this_02;
  undefined1 auVar1 [16];
  undefined1 auVar2 [8];
  bool bVar3;
  uint s;
  int iVar4;
  executable_task *pObj;
  byte bVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  byte bVar12;
  uint uVar13;
  void *pvVar14;
  ulong uVar15;
  float *pfVar16;
  uint8 p;
  uint uVar17;
  long lVar18;
  long lVar19;
  undefined1 uVar20;
  long lVar21;
  ulong uVar22;
  void *pvVar23;
  uint t;
  uint64 uVar24;
  dxt_hc *pdVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  vector<crnlib::vector<crnlib::alpha_selector_details>_> selector_details;
  vector<crnlib::SelectorNode> nodes;
  vector<unsigned_int> weights;
  vector<crnlib::vec<16U,_float>_> vectors;
  vector<unsigned_long_long> selectors;
  priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
  queue;
  tree_clusterizer<crnlib::vec<16U,_float>_> selector_vq;
  float v [8];
  undefined1 local_1a8 [8];
  uint64 *puStack_1a0;
  uint local_194;
  dxt_hc *local_190;
  elemental_vector local_188;
  vector<unsigned_int> local_178;
  vector<crnlib::vec<16U,_float>_> local_168;
  elemental_vector local_158;
  ulong local_140;
  ulong local_138;
  vector<bool> *local_130;
  priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
  local_128;
  tree_clusterizer<crnlib::vec<16U,_float>_> local_100;
  float afStack_58 [10];
  
  uVar13 = (this->m_num_blocks >> (this->m_has_subblocks & 0x1fU)) * this->m_num_alpha_blocks;
  uVar11 = this->m_pTask_pool->m_num_threads;
  local_158.m_p = (void *)0x0;
  local_158.m_size = 0;
  local_158.m_capacity = 0;
  if (uVar13 != 0) {
    elemental_vector::increase_capacity(&local_158,uVar13,uVar13 == 1,8,(object_mover)0x0,false);
    memset((void *)((local_158._8_8_ & 0xffffffff) * 8 + (long)local_158.m_p),0,
           (ulong)(uVar13 - local_158.m_size) << 3);
    local_158.m_size = uVar13;
  }
  local_194 = uVar11 + 1;
  if (this->m_num_alpha_blocks - 1 < 0xfffffffe) {
    uVar6 = 0;
    uVar10 = 1;
    do {
      if (this->m_num_blocks != 0) {
        bVar3 = this->m_has_subblocks;
        uVar15 = 0;
        do {
          uVar22 = (ulong)uVar6;
          uVar6 = uVar6 + 1;
          *(unsigned_long_long *)((long)local_158.m_p + uVar22 * 8) =
               this->m_block_selectors[uVar10].m_p[uVar15];
          uVar17 = (int)uVar15 + bVar3 + 1;
          uVar15 = (ulong)uVar17;
        } while (uVar17 < this->m_num_blocks);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < this->m_num_alpha_blocks + 1);
  }
  local_188.m_p = (void *)0x0;
  local_188.m_size = 0;
  local_188.m_capacity = 0;
  local_190 = this;
  local_138 = (ulong)uVar11;
  if (local_194 != 0) {
    iVar7 = 1;
    pvVar14 = local_158.m_p;
    do {
      pvVar23 = (void *)(((ulong)(local_158.m_size * iVar7) / (ulong)local_194) * 8 +
                        (long)local_158.m_p);
      if (pvVar14 != pvVar23) {
        if (local_188.m_capacity <= local_188.m_size) {
          elemental_vector::increase_capacity
                    (&local_188,local_188.m_size + 1,true,0x10,
                     vector<crnlib::SelectorNode>::object_mover,false);
        }
        lVar8 = (local_188._8_8_ & 0xffffffff) * 0x10;
        *(void **)((long)local_188.m_p + lVar8) = pvVar14;
        *(void **)((long)local_188.m_p + lVar8 + 8) = pvVar23;
        local_188.m_size = local_188.m_size + 1;
      }
      iVar4 = iVar7 - uVar11;
      iVar7 = iVar7 + 1;
      pvVar14 = pvVar23;
    } while (iVar4 != 1);
  }
  if (local_188.m_size != 0) {
    lVar8 = 0;
    uVar24 = 0;
    do {
      task_pool::queue_task
                (local_190->m_pTask_pool,SelectorNode::sort_task,uVar24,
                 (void *)((long)local_188.m_p + lVar8));
      uVar24 = uVar24 + 1;
      lVar8 = lVar8 + 0x10;
    } while (uVar24 < (local_188._8_8_ & 0xffffffff));
  }
  task_pool::join(local_190->m_pTask_pool);
  local_128.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_188.m_size != 0) {
    lVar8 = 0;
    uVar10 = 0;
    do {
      std::
      priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
      ::push(&local_128,(value_type *)((long)local_188.m_p + lVar8));
      uVar10 = uVar10 + 1;
      lVar8 = lVar8 + 0x10;
    } while (uVar10 < (local_188._8_8_ & 0xffffffff));
  }
  lVar8 = 0;
  do {
    afStack_58[lVar8] = (float)(int)lVar8 * 0.125 + 0.0625;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  local_168.m_p = (vec<16U,_float> *)0x0;
  local_168.m_size = 0;
  local_168.m_capacity = 0;
  local_178.m_p = (uint *)0x0;
  local_178.m_size = 0;
  local_178.m_capacity = 0;
  vector<crnlib::vec<16U,_float>_>::reserve(&local_168,local_158.m_size);
  vector<unsigned_int>::reserve(&local_178,local_158.m_size);
  if (local_128.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_128.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar10 = 0;
    do {
      puStack_1a0 = (local_128.c.
                     super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>
                     ._M_impl.super__Vector_impl_data._M_start)->pEnd;
      local_1a8 = (undefined1  [8])
                  ((local_128.c.
                    super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
                    _M_impl.super__Vector_impl_data._M_start)->p + 1);
      uVar15 = *(local_128.c.
                 super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
                 _M_impl.super__Vector_impl_data._M_start)->p;
      std::
      priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
      ::pop(&local_128);
      if (local_1a8 != (undefined1  [8])puStack_1a0) {
        std::
        priority_queue<crnlib::SelectorNode,_std::vector<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>,_std::less<crnlib::SelectorNode>_>
        ::push(&local_128,(value_type *)local_1a8);
      }
      uVar11 = (uint)uVar15 & 0xffff;
      uVar15 = uVar15 >> 0x10;
      if (local_168.m_size == 0 || uVar15 != uVar10) {
        lVar8 = 0xf;
        uVar10 = uVar15;
        do {
          *(float *)((long)&local_100.m_vectors + lVar8 * 4) = afStack_58[(uint)uVar10 & 7];
          uVar10 = uVar10 >> 3;
          bVar3 = lVar8 != 0;
          lVar8 = lVar8 + -1;
        } while (bVar3);
        if (local_168.m_capacity <= local_168.m_size) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&local_168,local_168.m_size + 1,true,0x40,(object_mover)0x0
                     ,false);
        }
        uVar10 = local_168._8_8_ & 0xffffffff;
        pfVar16 = local_168.m_p[uVar10].m_s + 0xc;
        pfVar16[0] = (float)local_100.m_vectorsInfo.m_size;
        pfVar16[1] = (float)local_100.m_vectorsInfo.m_capacity;
        *(VectorInfo **)(pfVar16 + 2) = local_100.m_vectorsInfoLeft.m_p;
        pfVar16 = local_168.m_p[uVar10].m_s + 8;
        pfVar16[0] = (float)local_100.m_weightedDotProducts.m_size;
        pfVar16[1] = (float)local_100.m_weightedDotProducts.m_capacity;
        *(VectorInfo **)(pfVar16 + 2) = local_100.m_vectorsInfo.m_p;
        pfVar16 = local_168.m_p[uVar10].m_s + 4;
        pfVar16[0] = (float)local_100.m_weightedVectors.m_size;
        pfVar16[1] = (float)local_100.m_weightedVectors.m_capacity;
        *(double **)(pfVar16 + 2) = local_100.m_weightedDotProducts.m_p;
        *(vec<16U,_float> **)local_168.m_p[uVar10].m_s = local_100.m_vectors;
        *(vec<16U,_float> **)(local_168.m_p[uVar10].m_s + 2) = local_100.m_weightedVectors.m_p;
        local_168.m_size = local_168.m_size + 1;
        if (local_178.m_capacity <= local_178.m_size) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&local_178,local_178.m_size + 1,true,4,(object_mover)0x0,
                     false);
        }
        local_178.m_p[local_178._8_8_ & 0xffffffff] = uVar11;
        local_178.m_size = local_178.m_size + 1;
        uVar10 = uVar15;
      }
      else {
        uVar6 = local_178.m_size - 1;
        if (CARRY4(uVar11,local_178.m_p[uVar6])) {
          local_178.m_p[uVar6] = 0xffffffff;
        }
        else {
          local_178.m_p[uVar6] = uVar11 + local_178.m_p[uVar6];
        }
      }
    } while (local_128.c.
             super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>._M_impl
             .super__Vector_impl_data._M_finish !=
             local_128.c.
             super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>._M_impl
             .super__Vector_impl_data._M_start);
  }
  pdVar25 = local_190;
  local_100.m_node_index_map.m_values.m_p = (raw_node *)0x0;
  local_100.m_node_index_map.m_values.m_size = 0;
  local_100.m_node_index_map.m_values.m_capacity = 0;
  local_100.m_vectorComparison.m_p = (bool *)0x0;
  local_100.m_vectorComparison.m_size = 0;
  local_100.m_vectorComparison.m_capacity = 0;
  local_100.m_vectorsInfoRight.m_p = (VectorInfo *)0x0;
  local_100.m_vectorsInfoRight.m_size = 0;
  local_100.m_vectorsInfoRight.m_capacity = 0;
  local_100.m_vectorsInfoLeft.m_p = (VectorInfo *)0x0;
  local_100.m_vectorsInfoLeft.m_size = 0;
  local_100.m_vectorsInfoLeft.m_capacity = 0;
  local_100.m_vectorsInfo.m_p = (VectorInfo *)0x0;
  local_100.m_vectorsInfo.m_size = 0;
  local_100.m_vectorsInfo.m_capacity = 0;
  local_100.m_weightedDotProducts.m_p = (double *)0x0;
  local_100.m_weightedDotProducts.m_size = 0;
  local_100.m_weightedDotProducts.m_capacity = 0;
  local_100.m_weightedVectors.m_p = (vec<16U,_float> *)0x0;
  local_100.m_weightedVectors.m_size = 0;
  local_100.m_weightedVectors.m_capacity = 0;
  local_100.m_node_index_map.m_hash_shift = 0x20;
  local_100.m_node_index_map.m_num_valid = 0;
  local_100.m_node_index_map.m_grow_threshold = 0;
  local_100.m_nodes.m_p = (vq_node *)0x0;
  local_100.m_nodes.m_size = 0;
  local_100.m_nodes.m_capacity = 0;
  local_100.m_codebook.m_p = (vec<16U,_float> *)0x0;
  local_100.m_codebook.m_size = 0;
  local_100.m_codebook.m_capacity = 0;
  tree_clusterizer<crnlib::vec<16U,_float>_>::generate_codebook
            (&local_100,local_168.m_p,local_178.m_p,local_168.m_size,
             (local_190->m_params).m_alpha_selector_codebook_size,false,local_190->m_pTask_pool);
  this_00 = &pdVar25->m_alpha_selectors;
  uVar13 = local_100.m_codebook.m_size;
  uVar11 = (pdVar25->m_alpha_selectors).m_size;
  if (uVar11 != local_100.m_codebook.m_size) {
    if (uVar11 <= local_100.m_codebook.m_size) {
      if ((pdVar25->m_alpha_selectors).m_capacity < local_100.m_codebook.m_size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_00,local_100.m_codebook.m_size,
                   uVar11 + 1 == local_100.m_codebook.m_size,8,(object_mover)0x0,false);
      }
      uVar11 = (pdVar25->m_alpha_selectors).m_size;
      memset((pdVar25->m_alpha_selectors).m_p + uVar11,0,(ulong)(uVar13 - uVar11) << 3);
    }
    (pdVar25->m_alpha_selectors).m_size = uVar13;
  }
  local_130 = &pdVar25->m_alpha_selectors_used;
  uVar13 = local_100.m_codebook.m_size;
  uVar11 = (pdVar25->m_alpha_selectors_used).m_size;
  if (uVar11 != local_100.m_codebook.m_size) {
    if (uVar11 <= local_100.m_codebook.m_size) {
      if ((pdVar25->m_alpha_selectors_used).m_capacity < local_100.m_codebook.m_size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)local_130,local_100.m_codebook.m_size,
                   uVar11 + 1 == local_100.m_codebook.m_size,1,(object_mover)0x0,false);
      }
      uVar11 = (pdVar25->m_alpha_selectors_used).m_size;
      memset((pdVar25->m_alpha_selectors_used).m_p + uVar11,0,(ulong)(uVar13 - uVar11));
    }
    (pdVar25->m_alpha_selectors_used).m_size = uVar13;
  }
  uVar11 = local_194;
  local_140 = (ulong)local_194;
  if (local_100.m_codebook.m_size != 0) {
    lVar8 = 0;
    uVar10 = 0;
    do {
      pfVar16 = (float *)((long)(local_100.m_codebook.m_p)->m_s + lVar8);
      this_00->m_p[uVar10] = 0;
      lVar9 = 0;
      do {
        uVar15 = (ulong)(*pfVar16 * 8.0);
        this_00->m_p[uVar10] =
             this_00->m_p[uVar10] |
             ((long)(*pfVar16 * 8.0 - 9.223372e+18) & (long)uVar15 >> 0x3f | uVar15) <<
             ((byte)lVar9 & 0x3f);
        lVar9 = lVar9 + 3;
        pfVar16 = pfVar16 + 1;
      } while (lVar9 != 0x30);
      uVar10 = uVar10 + 1;
      lVar8 = lVar8 + 0x40;
    } while (uVar10 < (local_100.m_codebook._8_8_ & 0xffffffff));
  }
  local_1a8 = (undefined1  [8])0x0;
  puStack_1a0 = (uint64 *)0x0;
  if (local_194 != 0) {
    elemental_vector::increase_capacity
              ((elemental_vector *)local_1a8,local_194,(int)local_138 == 0,0x10,(object_mover)0x0,
               false);
    if (uVar11 != (uint)puStack_1a0) {
      memset((uint64 *)((long)local_1a8 + ((ulong)puStack_1a0 & 0xffffffff) * 2 * 8),0,
             (ulong)(uVar11 - (uint)puStack_1a0) << 4);
    }
    puStack_1a0 = (uint64 *)CONCAT44(puStack_1a0._4_4_,uVar11);
    lVar8 = 0;
    uVar24 = 0;
    do {
      this_01 = (elemental_vector *)((long)local_1a8 + lVar8);
      uVar11 = (pdVar25->m_alpha_selectors).m_size;
      uVar6 = *(uint *)((long)local_1a8 + lVar8 + 8);
      if (uVar6 != uVar11) {
        if (uVar6 <= uVar11) {
          if (*(uint *)((long)local_1a8 + lVar8 + 0xc) < uVar11) {
            elemental_vector::increase_capacity
                      (this_01,uVar11,uVar6 + 1 == uVar11,0x204,
                       vector<crnlib::alpha_selector_details>::object_mover,false);
          }
          pdVar25 = local_190;
          uVar6 = this_01->m_size;
          if (uVar11 != uVar6) {
            uVar10 = (ulong)(uVar11 - uVar6) * 0x204 - 0x204;
            auVar1._8_8_ = 0;
            auVar1._0_8_ = uVar10;
            memset((void *)((ulong)uVar6 * 0x204 + (long)this_01->m_p),0,
                   (SUB168(auVar1 * ZEXT816(0xfe03f80fe03f80ff),8) & 0xfffffffffffffe00) +
                   (uVar10 / 0x204) * 4 + 0x204);
          }
        }
        this_01->m_size = uVar11;
      }
      auVar2 = local_1a8;
      this_02 = pdVar25->m_pTask_pool;
      pObj = (executable_task *)crnlib_malloc(0x28);
      pObj->_vptr_executable_task = (_func_int **)&PTR_execute_task_001c59c0;
      pObj[1]._vptr_executable_task = (_func_int **)local_190;
      pObj[2]._vptr_executable_task = (_func_int **)create_alpha_selector_codebook_task;
      pObj[3]._vptr_executable_task = (_func_int **)0x0;
      *(undefined4 *)&pObj[4]._vptr_executable_task = 1;
      bVar3 = task_pool::queue_task(this_02,pObj,uVar24,(void *)((long)auVar2 + lVar8));
      if (!bVar3) {
        crnlib_free(pObj);
      }
      uVar24 = uVar24 + 1;
      lVar8 = lVar8 + 0x10;
      pdVar25 = local_190;
    } while (local_140 != uVar24);
  }
  task_pool::join(pdVar25->m_pTask_pool);
  auVar2 = local_1a8;
  if (1 < local_194) {
    uVar10 = 1;
    do {
      if ((pdVar25->m_alpha_selectors).m_size != 0) {
        lVar8 = 0;
        uVar15 = 0;
        do {
          lVar18 = 0;
          lVar9 = lVar8;
          do {
            lVar19 = 8;
            lVar21 = lVar9;
            do {
              *(int *)(*(uint64 *)local_1a8 + lVar21) =
                   *(int *)(*(uint64 *)local_1a8 + lVar21) +
                   *(int *)(*(uint64 *)((long)local_1a8 + uVar10 * 2 * 8) + lVar21);
              lVar21 = lVar21 + 4;
              lVar19 = lVar19 + -1;
            } while (lVar19 != 0);
            lVar18 = lVar18 + 1;
            lVar9 = lVar9 + 0x20;
          } while (lVar18 != 0x10);
          lVar9 = uVar15 * 0x204;
          uVar20 = 1;
          if (*(char *)(*(uint64 *)local_1a8 + 0x200 + lVar9) == '\0') {
            uVar20 = *(undefined1 *)(*(uint64 *)((long)local_1a8 + uVar10 * 2 * 8) + 0x200 + lVar9);
          }
          *(undefined1 *)(*(uint64 *)local_1a8 + lVar9 + 0x200) = uVar20;
          uVar15 = uVar15 + 1;
          lVar8 = lVar8 + 0x204;
        } while (uVar15 < (pdVar25->m_alpha_selectors).m_size);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != local_140);
  }
  if ((pdVar25->m_alpha_selectors).m_size != 0) {
    uVar15 = 0;
    uVar10 = 0;
    do {
      local_140 = uVar10;
      local_130->m_p[uVar15] = *(bool *)(*(uint64 *)local_1a8 + 0x200 + uVar15 * 0x204);
      lVar8 = *(uint64 *)local_1a8 + local_140;
      this_00->m_p[uVar15] = 0;
      lVar9 = 0;
      bVar5 = 0;
      do {
        lVar18 = lVar8 + lVar9;
        bVar3 = *(uint *)(lVar8 + 8 + lVar9) < *(uint *)(lVar8 + 4 + lVar9);
        bVar26 = *(uint *)(lVar8 + 0x10 + lVar9) < *(uint *)(lVar8 + 0xc + lVar9);
        bVar27 = *(uint *)(lVar8 + 0x18 + lVar9) < *(uint *)(lVar8 + 0x14 + lVar9);
        bVar28 = *(uint *)(lVar8 + 0x1c + lVar9) < *(uint *)(lVar8 + lVar9);
        uVar11 = 0;
        if (bVar28) {
          uVar11 = 7;
        }
        lVar21 = 0;
        if (bVar28) {
          lVar21 = 0x1c;
        }
        if (*(uint *)(lVar18 + 4 + (ulong)bVar3 * 4) < *(uint *)(lVar21 + lVar18)) {
          uVar11 = (uint)(byte)(bVar3 + 1);
        }
        if (*(uint *)(lVar18 + 0x14 + (ulong)bVar27 * 4) <
            *(uint *)(lVar18 + 0xc + (ulong)bVar26 * 4)) {
          bVar12 = bVar27 + 5;
        }
        else {
          bVar12 = bVar26 + 3;
        }
        uVar6 = (uint)bVar12;
        if (*(uint *)(lVar18 + (ulong)uVar11 * 4) <= *(uint *)(lVar18 + (ulong)(uint)bVar12 * 4)) {
          uVar6 = uVar11;
        }
        this_00->m_p[uVar15] = this_00->m_p[uVar15] | (ulong)uVar6 << (bVar5 & 0x3f);
        bVar5 = bVar5 + 3;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x200);
      uVar15 = uVar15 + 1;
      uVar10 = local_140 + 0x204;
    } while (uVar15 < (local_190->m_alpha_selectors).m_size);
  }
  if (local_1a8 != (undefined1  [8])0x0) {
    uVar10 = (ulong)puStack_1a0 & 0xffffffff;
    if (uVar10 != 0) {
      lVar8 = 0;
      do {
        if (*(void **)((long)auVar2 + lVar8) != (void *)0x0) {
          crnlib_free(*(void **)((long)auVar2 + lVar8));
        }
        lVar8 = lVar8 + 0x10;
      } while (uVar10 << 4 != lVar8);
    }
    crnlib_free((void *)local_1a8);
  }
  tree_clusterizer<crnlib::vec<16U,_float>_>::~tree_clusterizer(&local_100);
  if (local_178.m_p != (uint *)0x0) {
    crnlib_free(local_178.m_p);
  }
  if (local_168.m_p != (vec<16U,_float> *)0x0) {
    crnlib_free(local_168.m_p);
  }
  if (local_128.c.super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.c.
                    super__Vector_base<crnlib::SelectorNode,_std::allocator<crnlib::SelectorNode>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_188.m_p != (void *)0x0) {
    crnlib_free(local_188.m_p);
  }
  if (local_158.m_p != (void *)0x0) {
    crnlib_free(local_158.m_p);
  }
  return;
}

Assistant:

void dxt_hc::create_alpha_selector_codebook() {
  uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  crnlib::vector<uint64> selectors(m_num_alpha_blocks * (m_has_subblocks ? m_num_blocks >> 1 : m_num_blocks));
  for (uint i = 0, c = cAlpha0; c < cAlpha0 + m_num_alpha_blocks; c++) {
    for (uint b = 0, step = m_has_subblocks ? 2 : 1; b < m_num_blocks; b += step)
      selectors[i++] = m_block_selectors[c][b];
  }

  crnlib::vector<SelectorNode> nodes;
  SelectorNode node(0, selectors.get_ptr());
  for (uint i = 0; i < num_tasks; i++) {
    node.p = node.pEnd;
    node.pEnd = selectors.get_ptr() + selectors.size() * (i + 1) / num_tasks;
    if (node.p != node.pEnd)
      nodes.push_back(node);
  }

  for (uint i = 0; i < nodes.size(); i++)
    m_pTask_pool->queue_task(&SelectorNode::sort_task, i, &nodes[i]);
  m_pTask_pool->join();

  std::priority_queue<SelectorNode> queue;
  for (uint i = 0; i < nodes.size(); i++)
    queue.push(nodes[i]);

  float v[8];
  for (uint s = 0; s < 8; s++)
    v[s] = (s + 0.5f) * 0.125f;

  crnlib::vector<vec16F> vectors;
  crnlib::vector<uint> weights;
  vectors.reserve(selectors.size());
  weights.reserve(selectors.size());
  for (uint64 prev_selector = 0; queue.size();) {
    SelectorNode node = queue.top();
    uint64 selector = *node.p++;
    queue.pop();
    if (node.p != node.pEnd)
      queue.push(node);
    uint weight = (uint16)selector;
    selector >>= 16;
    if (!vectors.size() || selector != prev_selector) {
      prev_selector = selector;
      vec16F vector;
      for (uint p = 0; p < 16; p++, selector >>= 3)
        vector[15 - p] = v[selector & 7];
      vectors.push_back(vector);
      weights.push_back(weight);
    } else if (weights.back() > UINT_MAX - weight) {
      weights.back() = UINT_MAX;
    } else {
      weights.back() += weight;
    }
  }

  tree_clusterizer<vec16F> selector_vq;
  selector_vq.generate_codebook(vectors.get_ptr(), weights.get_ptr(), vectors.size(), m_params.m_alpha_selector_codebook_size, false, m_pTask_pool);
  m_alpha_selectors.resize(selector_vq.get_codebook_size());
  m_alpha_selectors_used.resize(selector_vq.get_codebook_size());
  for (uint i = 0; i < selector_vq.get_codebook_size(); i++) {
    const vec16F& v = selector_vq.get_codebook_entry(i);
    m_alpha_selectors[i] = 0;
    for (uint sh = 0, j = 0; j < 16; j++, sh += 3)
      m_alpha_selectors[i] |= (uint64)(v[j] * 8.0f) << sh;
  }

  crnlib::vector<crnlib::vector<alpha_selector_details> > selector_details(num_tasks);
  for (uint t = 0; t < num_tasks; t++) {
    selector_details[t].resize(m_alpha_selectors.size());
    m_pTask_pool->queue_object_task(this, &dxt_hc::create_alpha_selector_codebook_task, t, &selector_details[t]);
  }
  m_pTask_pool->join();

  for (uint t = 1; t < num_tasks; t++) {
    for (uint i = 0; i < m_alpha_selectors.size(); i++) {
      for (uint8 p = 0; p < 16; p++) {
        for (uint8 s = 0; s < 8; s++)
          selector_details[0][i].error[p][s] += selector_details[t][i].error[p][s];
      }
      selector_details[0][i].used = selector_details[0][i].used || selector_details[t][i].used;
    }
  }

  for (uint i = 0; i < m_alpha_selectors.size(); i++) {
    m_alpha_selectors_used[i] = selector_details[0][i].used;
    uint (&errors)[16][8] = selector_details[0][i].error;
    m_alpha_selectors[i] = 0;
    for (uint sh = 0, p = 0; p < 16; p++, sh += 3) {
      uint* e = errors[p];
      uint8 s07 = e[7] < e[0] ? 7 : 0;
      uint8 s12 = e[2] < e[1] ? 2 : 1;
      uint8 s34 = e[4] < e[3] ? 4 : 3;
      uint8 s56 = e[6] < e[5] ? 6 : 5;
      uint8 s02 = e[s12] < e[s07] ? s12 : s07;
      uint8 s36 = e[s56] < e[s34] ? s56 : s34;
      m_alpha_selectors[i] |= (uint64)(e[s36] < e[s02] ? s36 : s02) << sh;
    }
  }
}